

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O0

void __thiscall
cfdcapi_common_CfdCreateSimpleHandle_Test::~cfdcapi_common_CfdCreateSimpleHandle_Test
          (cfdcapi_common_CfdCreateSimpleHandle_Test *this)

{
  void *in_RDI;
  
  ~cfdcapi_common_CfdCreateSimpleHandle_Test((cfdcapi_common_CfdCreateSimpleHandle_Test *)0x32c438);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(cfdcapi_common, CfdCreateSimpleHandle) {
  int ret = CfdCreateSimpleHandle(NULL);
  EXPECT_EQ(kCfdIllegalArgumentError, ret);

  void* handle = NULL;
  ret = CfdCreateSimpleHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}